

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

Lit __thiscall Minisat::Solver::pickBranchLit(Solver *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  lbool *plVar5;
  double dVar6;
  lbool local_1f;
  uint8_t local_1e;
  lbool local_1d;
  int local_1c;
  Solver *pSStack_18;
  Var next;
  Solver *this_local;
  
  local_1c = -1;
  pSStack_18 = this;
  dVar6 = drand(&this->random_seed);
  if ((dVar6 < this->random_var_freq) &&
     (bVar1 = Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::empty
                        (&this->order_heap), !bVar1)) {
    iVar3 = Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::size
                      (&this->order_heap);
    iVar3 = irand(&this->random_seed,iVar3);
    local_1c = Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&this->order_heap,iVar3);
    local_1d = value(this,local_1c);
    local_1e = l_Undef.value;
    bVar2 = lbool::operator==(&local_1d,l_Undef);
    bVar1 = false;
    if (bVar2) {
      pcVar4 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                          local_1c);
      bVar1 = *pcVar4 != '\0';
    }
    if (bVar1) {
      this->rnd_decisions = this->rnd_decisions + 1;
    }
  }
  while( true ) {
    bVar1 = true;
    if (local_1c != -1) {
      local_1f = value(this,local_1c);
      bVar2 = lbool::operator!=(&local_1f,l_Undef);
      bVar1 = true;
      if (!bVar2) {
        pcVar4 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                           (&(this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>
                            ,local_1c);
        bVar1 = *pcVar4 == '\0';
      }
    }
    if (!bVar1) goto LAB_00126d0f;
    bVar1 = Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::empty
                      (&this->order_heap);
    if (bVar1) break;
    local_1c = Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::removeMin
                         (&this->order_heap);
  }
  local_1c = -1;
LAB_00126d0f:
  if (local_1c == -1) {
    this_local._4_4_ = -2;
  }
  else {
    plVar5 = IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>::operator[]
                       (&(this->user_pol).
                         super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>,local_1c);
    bVar1 = lbool::operator!=(plVar5,l_Undef);
    iVar3 = local_1c;
    if (bVar1) {
      plVar5 = IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->user_pol).
                           super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>,local_1c
                         );
      bVar1 = lbool::operator==(plVar5,l_True);
      this_local._4_4_ = mkLit(iVar3,bVar1);
    }
    else if ((this->rnd_pol & 1U) == 0) {
      pcVar4 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->polarity).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                          local_1c);
      this_local._4_4_ = mkLit(iVar3,*pcVar4 != '\0');
    }
    else {
      dVar6 = drand(&this->random_seed);
      this_local._4_4_ = mkLit(iVar3,dVar6 < 0.5);
    }
  }
  return (Lit)this_local._4_4_;
}

Assistant:

Lit Solver::pickBranchLit()
{
    Var next = var_Undef;

    // Random decision:
    if (drand(random_seed) < random_var_freq && !order_heap.empty()){
        next = order_heap[irand(random_seed,order_heap.size())];
        if (value(next) == l_Undef && decision[next])
            rnd_decisions++; }

    // Activity based decision:
    while (next == var_Undef || value(next) != l_Undef || !decision[next])
        if (order_heap.empty()){
            next = var_Undef;
            break;
        }else
            next = order_heap.removeMin();

    // Choose polarity based on different polarity modes (global or per-variable):
    if (next == var_Undef)
        return lit_Undef;
    else if (user_pol[next] != l_Undef)
        return mkLit(next, user_pol[next] == l_True);
    else if (rnd_pol)
        return mkLit(next, drand(random_seed) < 0.5);
    else
        return mkLit(next, polarity[next]);
}